

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

ON__UINT64 __thiscall
ON_SerialNumberMap::Internal_HashTableAddSerialNumberBlock
          (ON_SerialNumberMap *this,ON_SN_BLOCK *blk)

{
  ON__UINT32 OVar1;
  SN_ELEMENT *pSVar2;
  SN_ELEMENT **ppSVar3;
  ON__UINT32 hash_i;
  SN_ELEMENT **hash_table_block;
  SN_ELEMENT *e1;
  SN_ELEMENT *e;
  ON__UINT32 active_id_count;
  ON_SN_BLOCK *blk_local;
  ON_SerialNumberMap *this_local;
  
  e._4_4_ = 0;
  if (((this->m_bHashTableIsValid != '\0') && (blk != (ON_SN_BLOCK *)0x0)) &&
     (blk->m_purged < blk->m_count)) {
    e1 = blk->m_sn;
    pSVar2 = e1 + blk->m_count;
    if (this->m_hash_block_count == 1) {
      ppSVar3 = *this->m_hash_table_blocks;
      for (; e1 < pSVar2; e1 = e1 + 1) {
        if (e1->m_id_active == '\0') {
          e1->m_next = (SN_ELEMENT *)0x0;
        }
        else {
          OVar1 = Internal_HashTableBlockRowIndex(e1->m_id_crc32);
          e1->m_next = ppSVar3[OVar1];
          ppSVar3[OVar1] = e1;
          e._4_4_ = e._4_4_ + 1;
        }
      }
    }
    else {
      for (; e1 < pSVar2; e1 = e1 + 1) {
        if (e1->m_id_active == '\0') {
          e1->m_next = (SN_ELEMENT *)0x0;
        }
        else {
          ppSVar3 = Internal_HashTableBlock(this,e1->m_id_crc32);
          OVar1 = Internal_HashTableBlockRowIndex(e1->m_id_crc32);
          e1->m_next = ppSVar3[OVar1];
          ppSVar3[OVar1] = e1;
          e._4_4_ = e._4_4_ + 1;
        }
      }
    }
  }
  return (ulong)e._4_4_;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::Internal_HashTableAddSerialNumberBlock( ON_SN_BLOCK* blk) const
{
  ON__UINT32 active_id_count = 0; // 4 bytes is enough for a single block

  if ( m_bHashTableIsValid && nullptr != blk && blk->m_purged < blk->m_count )
  {
    SN_ELEMENT* e = blk->m_sn;
    SN_ELEMENT* e1 = e + blk->m_count;
    struct SN_ELEMENT** hash_table_block;
    ON__UINT32 hash_i;
    if (1 == m_hash_block_count)
    {
      hash_table_block = m_hash_table_blocks[0];
      for (/* empty init */; e < e1; e++)
      {
        if (0 == e->m_id_active)
        {
          e->m_next = nullptr;
          continue;
        }
        hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32);
        e->m_next = hash_table_block[hash_i];
        hash_table_block[hash_i] = e;
        active_id_count++;
      }
    }
    else
    {
      for (/* empty init */; e < e1; e++)
      {
        if (0 == e->m_id_active)
        {
          e->m_next = nullptr;
          continue;
        }
        hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
        hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32);
        e->m_next = hash_table_block[hash_i];
        hash_table_block[hash_i] = e;
        active_id_count++;
      }
    }
  }

  return (ON__UINT64)active_id_count; // entire map may contain many blocks and more than 2^32 entries.
}